

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::to_string<std::allocator<char>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,basic_string_view<char,std::char_traits<char>> *this,allocator<char> *a)

{
  const_iterator __beg;
  const_iterator __end;
  allocator<char> *a_local;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  
  __beg = basic_string_view<char,_std::char_traits<char>_>::begin
                    ((basic_string_view<char,_std::char_traits<char>_> *)this);
  __end = basic_string_view<char,_std::char_traits<char>_>::end
                    ((basic_string_view<char,_std::char_traits<char>_> *)this);
  std::__cxx11::string::string<char_const*,void>((string *)__return_storage_ptr__,__beg,__end,a);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharT, Traits, Allocator> to_string(const Allocator& a = Allocator()) const {
			return std::basic_string<CharT, Traits, Allocator>(begin(), end(), a);
		}